

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O0

void __thiscall HBT_correlation::output_HBTcorrelation(HBT_correlation *this)

{
  long in_RDI;
  HBT_correlation *in_stack_00000500;
  HBT_correlation *in_stack_00000520;
  HBT_correlation *in_stack_00000540;
  
  if (*(int *)(in_RDI + 0x20c) == 1) {
    output_correlation_function_inv(in_stack_00000500);
  }
  if (*(int *)(in_RDI + 0x208) == 0) {
    output_correlation_function(in_stack_00000540);
  }
  else {
    output_correlation_function_Kphi_differential(in_stack_00000520);
  }
  return;
}

Assistant:

void HBT_correlation::output_HBTcorrelation() {
    if (invariant_radius_flag_ == 1) output_correlation_function_inv();

    if (azimuthal_flag_ == 0) {
        output_correlation_function();
    } else {
        output_correlation_function_Kphi_differential();
    }
}